

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndPopup(void)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  ppIVar1 = &GImGui->CurrentWindow;
  if (((GImGui->NavWindow == *ppIVar1) && (GImGui->NavMoveScoringItems == true)) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    *(byte *)&GImGui->NavMoveFlags = (byte)GImGui->NavMoveFlags | 2;
  }
  if (((*ppIVar1)->Flags & 0x1000000) != 0) {
    pIVar2->WithinEndChild = true;
  }
  End();
  pIVar2->WithinEndChild = false;
  return;
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.BeginPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy (e.g. focus scope could include wrap/loop policy flags used by new move requests)
    if (g.NavWindow == window)
        NavMoveRequestTryWrapping(window, ImGuiNavMoveFlags_LoopY);

    // Child-popups don't need to be laid out
    IM_ASSERT(g.WithinEndChild == false);
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}